

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

void prvTidyResetConfigToSnapshot(TidyDocImpl *doc)

{
  Bool BVar1;
  ulong uVar2;
  TidyOptionValue *new;
  TidyOptionImpl *option;
  uint changedUserTags;
  uint local_2c;
  
  new = (doc->config).snapshot;
  BVar1 = NeedReparseTagDecls((doc->config).value,new,&local_2c);
  option = option_defs;
  uVar2 = 0;
  while( true ) {
    if (uVar2 == 0x60) {
      if (BVar1 != no) {
        ReparseTagDecls(doc,local_2c);
        return;
      }
      return;
    }
    if (uVar2 != option->id) break;
    CopyOptionValue(doc,option,new + -0x61,new);
    option = option + 1;
    uVar2 = uVar2 + 1;
    new = new + 1;
  }
  __assert_fail("ixVal == (uint) option->id",
                "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/config.c"
                ,0x22e,"void prvTidyResetConfigToSnapshot(TidyDocImpl *)");
}

Assistant:

void TY_(ResetConfigToSnapshot)( TidyDocImpl* doc )
{
    uint ixVal;
    const TidyOptionImpl* option = option_defs;
    TidyOptionValue* value = &doc->config.value[ 0 ];
    const TidyOptionValue* snap  = &doc->config.snapshot[ 0 ];
    uint changedUserTags;
    Bool needReparseTagsDecls = NeedReparseTagDecls( value, snap,
                                                     &changedUserTags );
    
    for ( ixVal=0; ixVal < N_TIDY_OPTIONS; ++option, ++ixVal )
    {
        assert( ixVal == (uint) option->id );
        CopyOptionValue( doc, option, &value[ixVal], &snap[ixVal] );
    }
    if ( needReparseTagsDecls )
        ReparseTagDecls( doc, changedUserTags );
}